

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

int av1_adjust_q_from_delta_q_res(int delta_q_res,int prev_qindex,int curr_qindex)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = 0x100 - delta_q_res;
  if (curr_qindex < 0x100 - delta_q_res) {
    iVar1 = curr_qindex;
  }
  if (curr_qindex < delta_q_res) {
    iVar1 = delta_q_res;
  }
  iVar1 = iVar1 - prev_qindex;
  iVar2 = delta_q_res + 3;
  if (-1 < delta_q_res) {
    iVar2 = delta_q_res;
  }
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  uVar5 = iVar4 + (iVar2 >> 2) & -delta_q_res;
  uVar3 = -uVar5;
  if (-1 < iVar1) {
    uVar3 = uVar5;
  }
  iVar1 = 1;
  if (1 < (int)(uVar3 + prev_qindex)) {
    iVar1 = uVar3 + prev_qindex;
  }
  return iVar1;
}

Assistant:

int av1_adjust_q_from_delta_q_res(int delta_q_res, int prev_qindex,
                                  int curr_qindex) {
  curr_qindex = clamp(curr_qindex, delta_q_res, 256 - delta_q_res);
  const int sign_deltaq_index = curr_qindex - prev_qindex >= 0 ? 1 : -1;
  const int deltaq_deadzone = delta_q_res / 4;
  const int qmask = ~(delta_q_res - 1);
  int abs_deltaq_index = abs(curr_qindex - prev_qindex);
  abs_deltaq_index = (abs_deltaq_index + deltaq_deadzone) & qmask;
  int adjust_qindex = prev_qindex + sign_deltaq_index * abs_deltaq_index;
  adjust_qindex = AOMMAX(adjust_qindex, MINQ + 1);
  return adjust_qindex;
}